

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PhysBCFunct.H
# Opt level: O3

void __thiscall
amrex::GpuBndryFuncFab<PeleLMdummyFill>::operator()
          (GpuBndryFuncFab<PeleLMdummyFill> *this,Box *bx,FArrayBox *dest,int dcomp,int numcomp,
          Geometry *geom,Real time,Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcr,
          int bcomp,int orig_comp)

{
  uint uVar1;
  FilfcFace local_a;
  FilccCell local_9;
  
  uVar1 = (bx->btype).itype;
  if (uVar1 != 7) {
    if (uVar1 == 0) {
      ccfcdoit<amrex::FilccCell>(this,bx,dest,dcomp,numcomp,geom,time,bcr,bcomp,orig_comp,&local_9);
    }
    else {
      ccfcdoit<amrex::FilfcFace>(this,bx,dest,dcomp,numcomp,geom,time,bcr,bcomp,orig_comp,&local_a);
    }
    return;
  }
  nddoit(this,bx,dest,dcomp,numcomp,geom,time,bcr,bcomp,orig_comp);
  return;
}

Assistant:

PhysBCFunct (const Geometry& geom, const Vector<BCRec>& bcr, F const& f)
        : m_geom(geom), m_bcr(bcr), m_f(f)
        {}